

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O2

AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_> *
OpenMD::operator&&(AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                   *__return_storage_ptr__,
                  ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *cons1,
                  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *cons2)

{
  LessThanOrEqualToConstraint<int> local_60;
  GreaterThanOrEqualTo<int> local_38;
  
  GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo(&local_38,(GreaterThanOrEqualTo<int> *)cons1);
  LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
            (&local_60,(LessThanOrEqualToConstraint<int> *)cons2);
  AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>::
  AndParamConstraint(__return_storage_ptr__,&local_38,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline AndParamConstraint<Cons1T, Cons2T> operator&&(
      const ParamConstraintFacade<Cons1T>& cons1,
      const ParamConstraintFacade<Cons2T>& cons2) {
    return AndParamConstraint<Cons1T, Cons2T>(
        *static_cast<const Cons1T*>(&cons1),
        *static_cast<const Cons2T*>(&cons2));
  }